

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

CURLcode checkpasswd(char *kind,size_t i,_Bool last,char **userpwd)

{
  CURLcode CVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 local_968 [8];
  dynbuf dyn;
  char prompt [256];
  char passwd [2048];
  char *osep;
  char *psep;
  char **userpwd_local;
  _Bool last_local;
  size_t i_local;
  char *kind_local;
  
  if (*userpwd != (char *)0x0) {
    pcVar2 = strchr(*userpwd,0x3a);
    pcVar3 = strchr(*userpwd,0x3b);
    if ((pcVar2 == (char *)0x0) && (**userpwd != ';')) {
      memset(prompt + 0xf8,0,0x800);
      curlx_dyn_init((dynbuf *)local_968,0x19000);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      if ((i == 0) && (last)) {
        curl_msnprintf(&dyn.toobig,0x100,"Enter %s password for user \'%s\':",kind,*userpwd);
      }
      else {
        curl_msnprintf(&dyn.toobig,0x100,"Enter %s password for user \'%s\' on URL #%zu:",kind,
                       *userpwd,i + 1);
      }
      getpass_r((char *)&dyn.toobig,prompt + 0xf8,0x800);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = ';';
      }
      CVar1 = curlx_dyn_addf((dynbuf *)local_968,"%s:%s",*userpwd,prompt + 0xf8);
      if (CVar1 != CURLE_OK) {
        return CURLE_OUT_OF_MEMORY;
      }
      free(*userpwd);
      pcVar2 = curlx_dyn_ptr((dynbuf *)local_968);
      *userpwd = pcVar2;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode checkpasswd(const char *kind, /* for what purpose */
                            const size_t i,   /* operation index */
                            const bool last,  /* TRUE if last operation */
                            char **userpwd)   /* pointer to allocated string */
{
  char *psep;
  char *osep;

  if(!*userpwd)
    return CURLE_OK;

  /* Attempt to find the password separator */
  psep = strchr(*userpwd, ':');

  /* Attempt to find the options separator */
  osep = strchr(*userpwd, ';');

  if(!psep && **userpwd != ';') {
    /* no password present, prompt for one */
    char passwd[2048] = "";
    char prompt[256];
    struct curlx_dynbuf dyn;

    curlx_dyn_init(&dyn, MAX_USERPWDLENGTH);
    if(osep)
      *osep = '\0';

    /* build a nice-looking prompt */
    if(!i && last)
      msnprintf(prompt, sizeof(prompt),
                "Enter %s password for user '%s':",
                kind, *userpwd);
    else
      msnprintf(prompt, sizeof(prompt),
                "Enter %s password for user '%s' on URL #%zu:",
                kind, *userpwd, i + 1);

    /* get password */
    getpass_r(prompt, passwd, sizeof(passwd));
    if(osep)
      *osep = ';';

    if(curlx_dyn_addf(&dyn, "%s:%s", *userpwd, passwd))
      return CURLE_OUT_OF_MEMORY;

    /* return the new string */
    free(*userpwd);
    *userpwd = curlx_dyn_ptr(&dyn);
  }

  return CURLE_OK;
}